

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O0

void __thiscall leveldb::Table::ReadFilter(Table *this,Slice *filter_handle_value)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  void *pvVar4;
  undefined8 *in_RSI;
  Slice *in_RDI;
  BlockContents block;
  ReadOptions opt;
  BlockHandle filter_handle;
  Slice v;
  BlockContents *in_stack_00000148;
  BlockHandle *in_stack_00000150;
  ReadOptions *in_stack_00000158;
  Options *in_stack_00000160;
  RandomAccessFile *in_stack_00000168;
  Status *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff88;
  Status in_stack_ffffffffffffff90;
  Slice *in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa8;
  byte in_stack_ffffffffffffffa9;
  undefined6 in_stack_ffffffffffffffaa;
  ReadOptions local_50;
  Status local_38;
  BlockHandle local_30;
  undefined8 local_20;
  undefined8 local_18;
  
  local_20 = *in_RSI;
  local_18 = in_RSI[1];
  BlockHandle::BlockHandle(&local_30);
  BlockHandle::DecodeFrom
            ((BlockHandle *)
             CONCAT62(in_stack_ffffffffffffffaa,
                      CONCAT11(in_stack_ffffffffffffffa9,in_stack_ffffffffffffffa8)),
             in_stack_ffffffffffffffa0);
  bVar1 = Status::ok(&local_38);
  bVar2 = bVar1 ^ 0xff;
  Status::~Status(in_stack_ffffffffffffff70);
  if ((bVar2 & 1) == 0) {
    ReadOptions::ReadOptions(&local_50);
    if ((in_RDI->data_[10] & 1U) != 0) {
      local_50.verify_checksums = true;
    }
    BlockContents::BlockContents((BlockContents *)0x10d78e);
    ReadBlock(in_stack_00000168,in_stack_00000160,in_stack_00000158,in_stack_00000150,
              in_stack_00000148);
    bVar1 = Status::ok((Status *)&stack0xffffffffffffff90);
    Status::~Status(in_stack_ffffffffffffff70);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if ((in_stack_ffffffffffffffa9 & 1) != 0) {
        pcVar3 = Slice::data((Slice *)&stack0xffffffffffffff98);
        *(char **)(in_RDI->data_ + 0x880) = pcVar3;
      }
      pvVar4 = operator_new(0x28);
      FilterBlockReader::FilterBlockReader
                ((FilterBlockReader *)in_stack_ffffffffffffff90.state_,
                 (FilterPolicy *)CONCAT17(bVar2,in_stack_ffffffffffffff88),in_RDI);
      *(void **)(in_RDI->data_ + 0x878) = pvVar4;
    }
  }
  return;
}

Assistant:

void Table::ReadFilter(const Slice& filter_handle_value) {
  Slice v = filter_handle_value;
  BlockHandle filter_handle;
  if (!filter_handle.DecodeFrom(&v).ok()) {
    return;
  }

  // We might want to unify with ReadBlock() if we start
  // requiring checksum verification in Table::Open.
  ReadOptions opt;
  if (rep_->options.paranoid_checks) {
    opt.verify_checksums = true;
  }
  BlockContents block;
  if (!ReadBlock(rep_->file, rep_->options, opt, filter_handle, &block).ok()) {
    return;
  }
  if (block.heap_allocated) {
    rep_->filter_data = block.data.data();  // Will need to delete later
  }
  rep_->filter = new FilterBlockReader(rep_->options.filter_policy, block.data);
}